

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cc
# Opt level: O0

int process_certificate_policies(X509 *x509,X509_POLICY_LEVEL *level,int any_policy_allowed)

{
  bool bVar1;
  int iVar2;
  stack_st_POLICYINFO *sk;
  size_t sVar3;
  POLICYINFO *pPVar4;
  POLICYINFO *pPVar5;
  X509_POLICY_NODE *pXVar6;
  X509_POLICY_NODE *node;
  POLICYINFO *policy_1;
  size_t i_1;
  int previous_level_has_any_policy;
  POLICYINFO *policy;
  size_t i;
  int cert_has_any_policy;
  CERTIFICATEPOLICIES *policies;
  stack_st_X509_POLICY_NODE *new_nodes;
  int local_28;
  int critical;
  int ret;
  int any_policy_allowed_local;
  X509_POLICY_LEVEL *level_local;
  X509 *x509_local;
  
  local_28 = 0;
  policies = (CERTIFICATEPOLICIES *)0x0;
  critical = any_policy_allowed;
  _ret = level;
  level_local = (X509_POLICY_LEVEL *)x509;
  sk = (stack_st_POLICYINFO *)
       X509_get_ext_d2i((X509 *)x509,0x59,(int *)((long)&new_nodes + 4),(int *)0x0);
  if (sk == (stack_st_POLICYINFO *)0x0) {
    if (new_nodes._4_4_ != -1) {
      return 0;
    }
    x509_policy_level_clear(_ret);
    return 1;
  }
  sVar3 = sk_POLICYINFO_num(sk);
  if (sVar3 == 0) {
    ERR_put_error(0xb,0,0x90,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                  ,0xfa);
    goto LAB_002dd852;
  }
  sk_POLICYINFO_set_cmp_func(sk,policyinfo_cmp);
  sk_POLICYINFO_sort(sk);
  bVar1 = false;
  for (policy = (POLICYINFO *)0x0; pPVar4 = (POLICYINFO *)sk_POLICYINFO_num(sk), policy < pPVar4;
      policy = (POLICYINFO *)((long)&policy->policyid + 1)) {
    pPVar4 = sk_POLICYINFO_value(sk,(size_t)policy);
    iVar2 = is_any_policy(pPVar4->policyid);
    if (iVar2 != 0) {
      bVar1 = true;
    }
    if (policy != (POLICYINFO *)0x0) {
      pPVar5 = sk_POLICYINFO_value(sk,(size_t)((long)&policy[-1].qualifiers + 7));
      iVar2 = OBJ_cmp((ASN1_OBJECT *)pPVar5->policyid,(ASN1_OBJECT *)pPVar4->policyid);
      if (iVar2 == 0) {
        ERR_put_error(0xb,0,0x90,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                      ,0x109);
        goto LAB_002dd852;
      }
    }
  }
  iVar2 = _ret->has_any_policy;
  if ((!bVar1) || (critical == 0)) {
    sk_X509_POLICY_NODE_delete_if(_ret->nodes,delete_if_not_in_policies,sk);
    _ret->has_any_policy = 0;
  }
  if (iVar2 != 0) {
    policies = (CERTIFICATEPOLICIES *)sk_X509_POLICY_NODE_new_null();
    if (policies == (CERTIFICATEPOLICIES *)0x0) goto LAB_002dd852;
    for (policy_1 = (POLICYINFO *)0x0; pPVar4 = (POLICYINFO *)sk_POLICYINFO_num(sk),
        policy_1 < pPVar4; policy_1 = (POLICYINFO *)((long)&policy_1->policyid + 1)) {
      pPVar4 = sk_POLICYINFO_value(sk,(size_t)policy_1);
      iVar2 = is_any_policy(pPVar4->policyid);
      if (((iVar2 == 0) &&
          (pXVar6 = x509_policy_level_find(_ret,pPVar4->policyid), pXVar6 == (X509_POLICY_NODE *)0x0
          )) && ((pXVar6 = x509_policy_node_new(pPVar4->policyid), pXVar6 == (X509_POLICY_NODE *)0x0
                 || (sVar3 = sk_X509_POLICY_NODE_push((stack_st_X509_POLICY_NODE *)policies,pXVar6),
                    sVar3 == 0)))) {
        x509_policy_node_free(pXVar6);
        goto LAB_002dd852;
      }
    }
    iVar2 = x509_policy_level_add_nodes(_ret,(stack_st_X509_POLICY_NODE *)policies);
    if (iVar2 == 0) goto LAB_002dd852;
  }
  local_28 = 1;
LAB_002dd852:
  sk_X509_POLICY_NODE_pop_free((stack_st_X509_POLICY_NODE *)policies,x509_policy_node_free);
  CERTIFICATEPOLICIES_free((CERTIFICATEPOLICIES *)sk);
  return local_28;
}

Assistant:

static int process_certificate_policies(const X509 *x509,
                                        X509_POLICY_LEVEL *level,
                                        int any_policy_allowed) {
  int ret = 0;
  int critical;
  STACK_OF(X509_POLICY_NODE) *new_nodes = NULL;
  CERTIFICATEPOLICIES *policies = reinterpret_cast<CERTIFICATEPOLICIES *>(
      X509_get_ext_d2i(x509, NID_certificate_policies, &critical, NULL));

  {
    if (policies == NULL) {
      if (critical != -1) {
        return 0;  // Syntax error in the extension.
      }

      // RFC 5280, section 6.1.3, step (e).
      x509_policy_level_clear(level);
      return 1;
    }

    // certificatePolicies may not be empty. See RFC 5280, section 4.2.1.4.
    // TODO(https://crbug.com/boringssl/443): Move this check into the parser.
    if (sk_POLICYINFO_num(policies) == 0) {
      OPENSSL_PUT_ERROR(X509, X509_R_INVALID_POLICY_EXTENSION);
      goto err;
    }

    sk_POLICYINFO_set_cmp_func(policies, policyinfo_cmp);
    sk_POLICYINFO_sort(policies);
    int cert_has_any_policy = 0;
    for (size_t i = 0; i < sk_POLICYINFO_num(policies); i++) {
      const POLICYINFO *policy = sk_POLICYINFO_value(policies, i);
      if (is_any_policy(policy->policyid)) {
        cert_has_any_policy = 1;
      }
      if (i > 0 && OBJ_cmp(sk_POLICYINFO_value(policies, i - 1)->policyid,
                           policy->policyid) == 0) {
        // Per RFC 5280, section 4.2.1.4, |policies| may not have duplicates.
        OPENSSL_PUT_ERROR(X509, X509_R_INVALID_POLICY_EXTENSION);
        goto err;
      }
    }

    // This does the same thing as RFC 5280, section 6.1.3, step (d), though in
    // a slighty different order. |level| currently contains
    // "expected_policy_set" values of the previous level. See
    // |process_policy_mappings| for details.
    const int previous_level_has_any_policy = level->has_any_policy;

    // First, we handle steps (d.1.i) and (d.2). The net effect of these two
    // steps is to intersect |level| with |policies|, ignoring anyPolicy if it
    // is inhibited.
    if (!cert_has_any_policy || !any_policy_allowed) {
      sk_X509_POLICY_NODE_delete_if(level->nodes, delete_if_not_in_policies,
                                    policies);
      level->has_any_policy = 0;
    }

    // Step (d.1.ii) may attach new nodes to the previous level's anyPolicy
    // node.
    if (previous_level_has_any_policy) {
      new_nodes = sk_X509_POLICY_NODE_new_null();
      if (new_nodes == NULL) {
        goto err;
      }
      for (size_t i = 0; i < sk_POLICYINFO_num(policies); i++) {
        const POLICYINFO *policy = sk_POLICYINFO_value(policies, i);
        // Though we've reordered the steps slightly, |policy| is in |level| if
        // and only if it would have been a match in step (d.1.ii).
        if (!is_any_policy(policy->policyid) &&
            x509_policy_level_find(level, policy->policyid) == NULL) {
          X509_POLICY_NODE *node = x509_policy_node_new(policy->policyid);
          if (node == NULL ||  //
              !sk_X509_POLICY_NODE_push(new_nodes, node)) {
            x509_policy_node_free(node);
            goto err;
          }
        }
      }
      if (!x509_policy_level_add_nodes(level, new_nodes)) {
        goto err;
      }
    }

    ret = 1;
  }

err:
  sk_X509_POLICY_NODE_pop_free(new_nodes, x509_policy_node_free);
  CERTIFICATEPOLICIES_free(policies);
  return ret;
}